

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_ExceptionAnyThrow_Test::Body
          (iu_SyntaxTest_x_iutest_x_ExceptionAnyThrow_Test *this)

{
  bool bVar1;
  bad_exception *this_00;
  Fixed *fixed;
  int x_3;
  int x_2;
  undefined1 local_1e0 [4];
  int x_1;
  Fixed local_1b0;
  int local_14;
  iu_SyntaxTest_x_iutest_x_ExceptionAnyThrow_Test *piStack_10;
  int x;
  iu_SyntaxTest_x_iutest_x_ExceptionAnyThrow_Test *this_local;
  
  local_14 = 1;
  piStack_10 = this;
  iutest::detail::AlwaysZero();
  bVar1 = iutest::detail::AlwaysTrue();
  if (!bVar1) {
    memset(&local_1b0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1b0);
    fixed = iutest::AssertionHelper::Fixed::operator<<(&local_1b0,local_14);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x35a,
               "\nExpected: throw ::std::bad_exception() throws an exception.\n  Actual: it doesn\'s throws."
               ,kFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)local_1e0,fixed);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_1e0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1b0);
    return;
  }
  this_00 = (bad_exception *)__cxa_allocate_exception(8);
  std::bad_exception::bad_exception(this_00);
  __cxa_throw(this_00,&std::bad_exception::typeinfo,std::bad_exception::~bad_exception);
}

Assistant:

IUTEST(SyntaxTest, ExceptionAnyThrow)
{
    if( int x = 1 )
        IUTEST_ASSERT_ANY_THROW(throw ::std::bad_exception()) << x;
    if( int x = 1 )
        IUTEST_EXPECT_ANY_THROW(throw ::std::bad_exception()) << x;
    if( int x = 1 )
        IUTEST_INFORM_ANY_THROW(throw ::std::bad_exception()) << x;
    if( int x = 1 )
        IUTEST_ASSUME_ANY_THROW(throw ::std::bad_exception()) << x;
}